

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O3

string * __thiscall
nonius::detail::pretty_duration_abi_cxx11_
          (string *__return_storage_ptr__,detail *this,fp_seconds secs)

{
  undefined5 *puVar1;
  ostream *poVar2;
  string units;
  ostringstream ss;
  char local_1b1;
  double local_1b0;
  char *local_1a8;
  long local_1a0;
  char local_198;
  undefined1 uStack_197;
  undefined1 uStack_196;
  undefined5 uStack_195;
  double local_188;
  long local_180;
  long local_178 [13];
  ios_base local_110 [264];
  
  if (2.0 <= secs.__r) {
    puVar1 = (undefined5 *)&uStack_197;
    local_198 = 's';
    local_1a0 = 1;
    local_1b0 = 1.0;
  }
  else {
    puVar1 = (undefined5 *)&uStack_196;
    if (0.002 <= secs.__r) {
      local_198 = 'm';
      uStack_197 = 0x73;
      local_1a0 = 2;
      local_1b0 = 1000.0;
    }
    else if (2e-06 <= secs.__r) {
      puVar1 = &uStack_195;
      uStack_196 = 0x73;
      local_198 = -0x32;
      uStack_197 = 0xbc;
      local_1a0 = 3;
      local_1b0 = 1000000.0;
    }
    else {
      local_198 = 'n';
      uStack_197 = 0x73;
      local_1a0 = 2;
      local_1b0 = 1000000000.0;
    }
  }
  local_1a8 = &local_198;
  *(undefined1 *)puVar1 = 0;
  local_188 = secs.__r;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_180);
  *(long *)((long)local_178 + *(long *)(local_180 + -0x18)) =
       (long)*(int *)((long)local_178 + *(long *)(local_180 + -0x18));
  poVar2 = std::ostream::_M_insert<double>(local_1b0 * local_188);
  local_1b1 = ' ';
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_1b1,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_1a8,local_1a0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_180);
  std::ios_base::~ios_base(local_110);
  if (local_1a8 != &local_198) {
    operator_delete(local_1a8,
                    CONCAT53(uStack_195,CONCAT12(uStack_196,CONCAT11(uStack_197,local_198))) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string pretty_duration(fp_seconds secs) {
            auto magnitude = get_magnitude(secs);
            auto units = units_for_magnitude(magnitude);
#ifdef NONIUS_MSVC
            if(units == "μs") units = "us";
#endif
            std::ostringstream ss;
            ss << std::setprecision(ss.precision());
            ss << (secs.count() * magnitude) << ' ' << units;
            return ss.str();
        }